

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

char * LocaleStringBuilder(char c,char *source,size_t source_capacity,char *dest,char *dest_end)

{
  char cVar1;
  long lVar2;
  
  if ((((source != (char *)0x0) && (dest != (char *)0x0)) && (dest_end != (char *)0x0)) &&
     ((dest < dest_end && (source[source_capacity - 1] == '\0')))) {
    if (*source == '\0') {
      *dest = '\0';
      return dest;
    }
    if (c != '\0') {
      *dest = c;
      dest = dest + 1;
    }
    if (dest_end <= dest) {
      return (char *)0x0;
    }
    lVar2 = 0;
    do {
      cVar1 = source[lVar2];
      dest[lVar2] = cVar1;
      if (cVar1 == '\0') {
        return dest + lVar2;
      }
      lVar2 = lVar2 + 1;
    } while ((long)dest_end - (long)dest != lVar2);
  }
  return (char *)0x0;
}

Assistant:

static char* LocaleStringBuilder(
  char c,
  const char* source,
  size_t source_capacity,
  char* dest,
  char* dest_end
  )
{
  if ( nullptr == dest || nullptr == dest_end || nullptr == source || source_capacity <= 0 )
    return nullptr;
  if ( 0 != source[source_capacity - 1])
    return nullptr;
  if (dest < dest_end)
  {
    if (0 == source[0])
    {
      *dest = 0;
      return dest;
    }
    if (c > 0 )
      *dest++ = c;
    while (dest < dest_end)
    {
      if (0 == (*dest = *source++))
        return dest;
      dest++;
    }
  }
  return nullptr;
}